

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# os-linux.c
# Opt level: O0

FUNCTION_RETURN getCpuId(uchar *identifier)

{
  uint local_28 [2];
  uint cpuinfo [4];
  uint i;
  uchar *identifier_local;
  
  memset(local_28,0,0x10);
  _getCpuid(local_28,0);
  for (cpuinfo[3] = 0; cpuinfo[3] < 3; cpuinfo[3] = cpuinfo[3] + 1) {
    identifier[cpuinfo[3] << 1] = (uchar)local_28[cpuinfo[3]];
    identifier[cpuinfo[3] * 2 + 1] = (uchar)(local_28[cpuinfo[3]] >> 8);
  }
  return FUNC_RET_OK;
}

Assistant:

FUNCTION_RETURN getCpuId(unsigned char identifier[6]) {
	unsigned int i;
	unsigned int cpuinfo[4] = { 0, 0, 0, 0 };
	_getCpuid(cpuinfo, 0);
	for (i = 0; i < 3; i++) {
		identifier[i * 2] = cpuinfo[i] & 0xFF;
		identifier[i * 2 + 1] = (cpuinfo[i] & 0xFF00) >> 8;
	}
	return FUNC_RET_OK;
}